

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O0

void __thiscall WebServer::returnConnInLoop(WebServer *this,HttpConnPtr *conn)

{
  shared_ptr<HttpConn> local_28;
  HttpConnPtr *local_18;
  HttpConnPtr *conn_local;
  WebServer *this_local;
  
  local_18 = conn;
  conn_local = (HttpConnPtr *)this;
  EventLoop::assertInLoopThread(this->loop_);
  std::shared_ptr<HttpConn>::shared_ptr(&local_28,conn);
  HttpConnPool::addFreeConn(&this->connPool_,&local_28);
  std::shared_ptr<HttpConn>::~shared_ptr(&local_28);
  return;
}

Assistant:

void WebServer::returnConnInLoop(HttpConnPtr conn) {
    loop_->assertInLoopThread();
    connPool_.addFreeConn(std::move(conn));
}